

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscache.cpp
# Opt level: O1

void __thiscall QNetworkAccessCache::timerEvent(QNetworkAccessCache *this,QTimerEvent *param_1)

{
  long lVar1;
  void *pvVar2;
  int *piVar3;
  char cVar4;
  QNetworkAccessCache *pQVar5;
  
  if (*(long *)(this + 0x18) != 0) {
    do {
      cVar4 = QDeadlineTimer::hasExpired();
      if (cVar4 == '\0') break;
      lVar1 = *(long *)(*(long *)(this + 0x18) + 0x30);
      (**(code **)(**(long **)(*(long *)(this + 0x18) + 0x38) + 0x10))();
      QHash<QByteArray,_QNetworkAccessCache::Node_*>::removeImpl<QByteArray>
                ((QHash<QByteArray,_QNetworkAccessCache::Node_*> *)(this + 0x10),
                 (QByteArray *)(*(long *)(this + 0x18) + 0x10));
      pvVar2 = *(void **)(this + 0x18);
      if (pvVar2 != (void *)0x0) {
        piVar3 = *(int **)((long)pvVar2 + 0x10);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate(*(QArrayData **)((long)pvVar2 + 0x10),1,0x10);
          }
        }
        operator_delete(pvVar2,0x48);
      }
      *(long *)(this + 0x18) = lVar1;
    } while (lVar1 != 0);
  }
  pQVar5 = (QNetworkAccessCache *)(*(long *)(this + 0x18) + 0x28);
  if (*(long *)(this + 0x18) == 0) {
    pQVar5 = this + 0x20;
  }
  *(undefined8 *)pQVar5 = 0;
  updateTimer(this);
  return;
}

Assistant:

void QNetworkAccessCache::timerEvent(QTimerEvent *)
{
    while (firstExpiringNode && firstExpiringNode->timer.hasExpired()) {
        Node *next = firstExpiringNode->next;
        firstExpiringNode->object->dispose();
        hash.remove(firstExpiringNode->key); // `firstExpiringNode` gets deleted
        delete firstExpiringNode;
        firstExpiringNode = next;
    }

    // fixup the list
    if (firstExpiringNode)
        firstExpiringNode->previous = nullptr;
    else
        lastExpiringNode = nullptr;

    updateTimer();
}